

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_service_client_auth.c
# Opt level: O0

IOTHUB_SERVICE_CLIENT_AUTH_HANDLE
create_from_connection_string(char *connectionString,_Bool useSharedAccessSignature)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  STRING_HANDLE connection_string_00;
  MAP_HANDLE handle;
  char *pcVar3;
  char *pcVar4;
  char *psz;
  LOGGER_LOG l_23;
  LOGGER_LOG l_22;
  LOGGER_LOG l_21;
  LOGGER_LOG l_20;
  LOGGER_LOG l_19;
  LOGGER_LOG l_18;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  char *iothubSuffix;
  char *iothubName;
  char *sharedAccess;
  char *deviceId;
  char *keyName;
  char *hostName;
  STRING_HANDLE shared_access;
  STRING_HANDLE host_name_string;
  STRING_HANDLE token_value_string;
  STRING_HANDLE token_key_string;
  STRING_TOKENIZER_HANDLE tokenizer;
  LOGGER_LOG l_3;
  MAP_HANDLE connection_string_values_map;
  LOGGER_LOG l_2;
  STRING_HANDLE connection_string;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_SERVICE_CLIENT_AUTH_HANDLE result;
  _Bool useSharedAccessSignature_local;
  char *connectionString_local;
  
  if (connectionString == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",0x29,1,"Input parameter is NULL: connectionString")
      ;
    }
    return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
  }
  l = (LOGGER_LOG)malloc(0x30);
  if ((IOTHUB_SERVICE_CLIENT_AUTH *)l == (IOTHUB_SERVICE_CLIENT_AUTH *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
              ,"create_from_connection_string",0x31,1,"Malloc failed for IOTHUB_SERVICE_CLIENT_AUTH"
             );
    return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
  }
  memset(l,0,0x30);
  connection_string_00 = STRING_construct(connectionString);
  if (connection_string_00 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",0x3a,1,"STRING_construct failed");
    }
    free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
    return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
  }
  handle = connectionstringparser_parse(connection_string_00);
  if (handle == (MAP_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",0x43,1,"Tokenizing failed on connectionString");
    }
    free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
    l = (LOGGER_LOG)0x0;
    goto LAB_00143210;
  }
  token_key_string = (STRING_HANDLE)0x0;
  token_value_string = (STRING_HANDLE)0x0;
  host_name_string = (STRING_HANDLE)0x0;
  shared_access = (STRING_HANDLE)0x0;
  hostName = (char *)0x0;
  iothubName = (char *)0x0;
  pcVar3 = Map_GetValueFromKey(handle,IOTHUBSHAREDACESSKEYNAME);
  pcVar4 = Map_GetValueFromKey(handle,IOTHUBDEVICEID);
  memset(l,0,0x30);
  if ((pcVar3 == (char *)0x0) && (pcVar4 == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",0x5b,1,
                "Couldn\'t find %s or %s in connection string",IOTHUBSHAREDACESSKEYNAME,
                IOTHUBDEVICEID);
    }
    free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
    l = (LOGGER_LOG)0x0;
  }
  else if ((pcVar3 == (char *)0x0) || (pcVar4 == (char *)0x0)) {
    psz = Map_GetValueFromKey(handle,IOTHUBHOSTNAME);
    if (psz == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                  ,"create_from_connection_string",0x67,1,"Couldn\'t find %s in connection string",
                  IOTHUBHOSTNAME);
      }
      free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
      l = (LOGGER_LOG)0x0;
    }
    else if ((useSharedAccessSignature) ||
            (iothubName = Map_GetValueFromKey(handle,IOTHUBSHAREDACESSKEY),
            iothubName != (char *)0x0)) {
      if ((useSharedAccessSignature) &&
         (iothubName = Map_GetValueFromKey(handle,IOTHUBSHAREDACESSSIGNATURE),
         iothubName == (char *)0x0)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                    ,"create_from_connection_string",0x73,1,"Couldn\'t find %s in connection string"
                    ,IOTHUBSHAREDACESSSIGNATURE);
        }
        free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        shared_access = STRING_construct(psz);
        if (shared_access == (STRING_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                      ,"create_from_connection_string",0x79,1,"STRING_construct failed");
          }
          free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          token_key_string = (STRING_HANDLE)STRING_TOKENIZER_create(shared_access);
          if ((STRING_TOKENIZER_HANDLE)token_key_string == (STRING_TOKENIZER_HANDLE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                        ,"create_from_connection_string",0x7f,1,"Error creating STRING tokenizer");
            }
            free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            token_value_string = STRING_new();
            if (token_value_string == (STRING_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                          ,"create_from_connection_string",0x85,1,
                          "Error creating key token STRING_HANDLE");
              }
              free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
              l = (LOGGER_LOG)0x0;
            }
            else {
              host_name_string = STRING_new();
              if (host_name_string == (STRING_HANDLE)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                            ,"create_from_connection_string",0x8b,1,
                            "Error creating value token STRING_HANDLE");
                }
                free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                l = (LOGGER_LOG)0x0;
              }
              else {
                iVar1 = STRING_TOKENIZER_get_next_token
                                  ((STRING_TOKENIZER_HANDLE)token_key_string,token_value_string,".")
                ;
                if (iVar1 == 0) {
                  iVar1 = STRING_TOKENIZER_get_next_token
                                    ((STRING_TOKENIZER_HANDLE)token_key_string,host_name_string,"0")
                  ;
                  if (iVar1 == 0) {
                    iVar1 = mallocAndStrcpy_s((char **)l,psz);
                    if (iVar1 == 0) {
                      if ((pcVar3 == (char *)0x0) ||
                         (iVar1 = mallocAndStrcpy_s(&((IOTHUB_SERVICE_CLIENT_AUTH *)l)->keyName,
                                                    pcVar3), iVar1 == 0)) {
                        if ((pcVar4 == (char *)0x0) ||
                           (iVar1 = mallocAndStrcpy_s(&((IOTHUB_SERVICE_CLIENT_AUTH *)l)->deviceId,
                                                      pcVar4), iVar1 == 0)) {
                          if (((useSharedAccessSignature) || (iothubName == (char *)0x0)) ||
                             (iVar1 = mallocAndStrcpy_s(&((IOTHUB_SERVICE_CLIENT_AUTH *)l)->
                                                         sharedAccessKey,iothubName), iVar1 == 0)) {
                            if ((useSharedAccessSignature) && (iothubName != (char *)0x0)) {
                              hostName = (char *)STRING_construct(IOTHUBSASPREFIX);
                              if (((STRING_HANDLE)hostName != (STRING_HANDLE)0x0) &&
                                 (iVar1 = STRING_concat((STRING_HANDLE)hostName,iothubName),
                                 iVar1 == 0)) {
                                pcVar3 = STRING_c_str((STRING_HANDLE)hostName);
                                iVar1 = mallocAndStrcpy_s(&((IOTHUB_SERVICE_CLIENT_AUTH *)l)->
                                                           sharedAccessKey,pcVar3);
                                if (iVar1 == 0) goto LAB_00142fee;
                              }
                              p_Var2 = xlogging_get_log_function();
                              if (p_Var2 != (LOGGER_LOG)0x0) {
                                (*p_Var2)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                          ,"create_from_connection_string",0xb9,1,
                                          "mallocAndStrcpy_s failed for sharedAccessSignature");
                              }
                              free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                              l = (LOGGER_LOG)0x0;
                            }
                            else {
LAB_00142fee:
                              pcVar3 = STRING_c_str(token_value_string);
                              if (pcVar3 == (char *)0x0) {
                                p_Var2 = xlogging_get_log_function();
                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                  (*p_Var2)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                            ,"create_from_connection_string",0xbf,1,
                                            "STRING_c_str failed for iothubName");
                                }
                                free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                                l = (LOGGER_LOG)0x0;
                              }
                              else {
                                pcVar4 = STRING_c_str(host_name_string);
                                if (pcVar4 == (char *)0x0) {
                                  p_Var2 = xlogging_get_log_function();
                                  if (p_Var2 != (LOGGER_LOG)0x0) {
                                    (*p_Var2)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                              ,"create_from_connection_string",0xc5,1,
                                              "STRING_c_str failed for iothubSuffix");
                                  }
                                  free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                                  l = (LOGGER_LOG)0x0;
                                }
                                else {
                                  iVar1 = mallocAndStrcpy_s(&((IOTHUB_SERVICE_CLIENT_AUTH *)l)->
                                                             iothubName,pcVar3);
                                  if (iVar1 == 0) {
                                    iVar1 = mallocAndStrcpy_s(&((IOTHUB_SERVICE_CLIENT_AUTH *)l)->
                                                               iothubSuffix,pcVar4);
                                    if (iVar1 != 0) {
                                      p_Var2 = xlogging_get_log_function();
                                      if (p_Var2 != (LOGGER_LOG)0x0) {
                                        (*p_Var2)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                                  ,"create_from_connection_string",0xd1,1,
                                                  "mallocAndStrcpy_s failed for sharedAccessKey");
                                      }
                                      free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                                      l = (LOGGER_LOG)0x0;
                                    }
                                  }
                                  else {
                                    p_Var2 = xlogging_get_log_function();
                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                      (*p_Var2)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                                ,"create_from_connection_string",0xcb,1,
                                                "mallocAndStrcpy_s failed for sharedAccessKey");
                                    }
                                    free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                                    l = (LOGGER_LOG)0x0;
                                  }
                                }
                              }
                            }
                          }
                          else {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                        ,"create_from_connection_string",0xaf,1,
                                        "mallocAndStrcpy_s failed for sharedAccessKey");
                            }
                            free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                            l = (LOGGER_LOG)0x0;
                          }
                        }
                        else {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                      ,"create_from_connection_string",0xa9,1,
                                      "mallocAndStrcpy_s failed for keyName");
                          }
                          free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                          l = (LOGGER_LOG)0x0;
                        }
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                    ,"create_from_connection_string",0xa3,1,
                                    "mallocAndStrcpy_s failed for keyName");
                        }
                        free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                        l = (LOGGER_LOG)0x0;
                      }
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                  ,"create_from_connection_string",0x9d,1,
                                  "mallocAndStrcpy_s failed for hostName");
                      }
                      free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                      l = (LOGGER_LOG)0x0;
                    }
                  }
                  else {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                                ,"create_from_connection_string",0x97,1,
                                "Error reading value token STRING");
                    }
                    free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                    l = (LOGGER_LOG)0x0;
                  }
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                              ,"create_from_connection_string",0x91,1,
                              "Error reading key token STRING");
                  }
                  free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
                  l = (LOGGER_LOG)0x0;
                }
              }
            }
          }
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                  ,"create_from_connection_string",0x6d,1,"Couldn\'t find %s in connection string",
                  IOTHUBSHAREDACESSKEY);
      }
      free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
      l = (LOGGER_LOG)0x0;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",0x61,1,
                "Both %s and %s in connection string were set, they are mutually exclusive",
                IOTHUBSHAREDACESSKEYNAME,IOTHUBDEVICEID);
    }
    free_service_client_auth((IOTHUB_SERVICE_CLIENT_AUTH *)l);
    l = (LOGGER_LOG)0x0;
  }
  STRING_delete(token_value_string);
  STRING_delete(host_name_string);
  STRING_delete(shared_access);
  STRING_TOKENIZER_destroy((STRING_TOKENIZER_HANDLE)token_key_string);
  Map_Destroy(handle);
  if (useSharedAccessSignature) {
    STRING_delete((STRING_HANDLE)hostName);
  }
LAB_00143210:
  STRING_delete(connection_string_00);
  return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)l;
}

Assistant:

static IOTHUB_SERVICE_CLIENT_AUTH_HANDLE create_from_connection_string(const char* connectionString, bool useSharedAccessSignature)
{
    IOTHUB_SERVICE_CLIENT_AUTH_HANDLE result;

    if (connectionString == NULL)
    {
        LogError("Input parameter is NULL: connectionString");
        result = NULL;
    }
    else
    {
        result = malloc(sizeof(IOTHUB_SERVICE_CLIENT_AUTH));
        if (result == NULL)
        {
            LogError("Malloc failed for IOTHUB_SERVICE_CLIENT_AUTH");
        }
        else
        {
            memset(result, 0, sizeof(*result));

            STRING_HANDLE connection_string;
            if ((connection_string = STRING_construct(connectionString)) == NULL)
            {
                LogError("STRING_construct failed");
                free_service_client_auth(result);
                result = NULL;
            }
            else
            {
                MAP_HANDLE connection_string_values_map;
                if ((connection_string_values_map = connectionstringparser_parse(connection_string)) == NULL)
                {
                    LogError("Tokenizing failed on connectionString");
                    free_service_client_auth(result);
                    result = NULL;
                }
                else
                {
                    STRING_TOKENIZER_HANDLE tokenizer = NULL;
                    STRING_HANDLE token_key_string = NULL;
                    STRING_HANDLE token_value_string = NULL;
                    STRING_HANDLE host_name_string = NULL;
                    STRING_HANDLE shared_access = NULL;
                    const char* hostName;
                    const char* keyName;
                    const char* deviceId;
                    const char* sharedAccess = NULL;
                    const char* iothubName;
                    const char* iothubSuffix;

                    keyName = Map_GetValueFromKey(connection_string_values_map, IOTHUBSHAREDACESSKEYNAME);
                    deviceId = Map_GetValueFromKey(connection_string_values_map, IOTHUBDEVICEID);

                    (void)memset(result, 0, sizeof(IOTHUB_SERVICE_CLIENT_AUTH));
                    if ((keyName == NULL) && (deviceId == NULL))
                    {
                        LogError("Couldn't find %s or %s in connection string", IOTHUBSHAREDACESSKEYNAME, IOTHUBDEVICEID);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((keyName != NULL) && (deviceId != NULL))
                    {
                        LogError("Both %s and %s in connection string were set, they are mutually exclusive", IOTHUBSHAREDACESSKEYNAME, IOTHUBDEVICEID);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((hostName = Map_GetValueFromKey(connection_string_values_map, IOTHUBHOSTNAME)) == NULL)
                    {
                        LogError("Couldn't find %s in connection string", IOTHUBHOSTNAME);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (!useSharedAccessSignature && (sharedAccess = Map_GetValueFromKey(connection_string_values_map, IOTHUBSHAREDACESSKEY)) == NULL)
                    {
                        LogError("Couldn't find %s in connection string", IOTHUBSHAREDACESSKEY);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (useSharedAccessSignature && (sharedAccess = Map_GetValueFromKey(connection_string_values_map, IOTHUBSHAREDACESSSIGNATURE)) == NULL)
                    {
                        LogError("Couldn't find %s in connection string", IOTHUBSHAREDACESSSIGNATURE);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((host_name_string = STRING_construct(hostName)) == NULL)
                    {
                        LogError("STRING_construct failed");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((tokenizer = STRING_TOKENIZER_create(host_name_string)) == NULL)
                    {
                        LogError("Error creating STRING tokenizer");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((token_key_string = STRING_new()) == NULL)
                    {
                        LogError("Error creating key token STRING_HANDLE");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((token_value_string = STRING_new()) == NULL)
                    {
                        LogError("Error creating value token STRING_HANDLE");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (STRING_TOKENIZER_get_next_token(tokenizer, token_key_string, ".") != 0)
                    {
                        LogError("Error reading key token STRING");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (STRING_TOKENIZER_get_next_token(tokenizer, token_value_string, "0") != 0)
                    {
                        LogError("Error reading value token STRING");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (mallocAndStrcpy_s(&result->hostname, hostName) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for hostName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((keyName != NULL) && (mallocAndStrcpy_s(&result->keyName, keyName) != 0))
                    {
                        LogError("mallocAndStrcpy_s failed for keyName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((deviceId != NULL) && (mallocAndStrcpy_s(&result->deviceId, deviceId) != 0))
                    {
                        LogError("mallocAndStrcpy_s failed for keyName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (!useSharedAccessSignature && (sharedAccess != NULL) && mallocAndStrcpy_s(&result->sharedAccessKey, sharedAccess) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (useSharedAccessSignature &&
                        (sharedAccess != NULL) &&
                        (((shared_access = STRING_construct(IOTHUBSASPREFIX)) == NULL) ||
                        (STRING_concat(shared_access, sharedAccess) != 0) ||
                        (mallocAndStrcpy_s(&result->sharedAccessKey, STRING_c_str(shared_access)) != 0)))
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessSignature");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((iothubName = STRING_c_str(token_key_string)) == NULL)
                    {
                        LogError("STRING_c_str failed for iothubName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((iothubSuffix = STRING_c_str(token_value_string)) == NULL)
                    {
                        LogError("STRING_c_str failed for iothubSuffix");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (mallocAndStrcpy_s(&result->iothubName, iothubName) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (mallocAndStrcpy_s(&result->iothubSuffix, iothubSuffix) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    STRING_delete(token_key_string);
                    STRING_delete(token_value_string);
                    STRING_delete(host_name_string);
                    STRING_TOKENIZER_destroy(tokenizer);
                    Map_Destroy(connection_string_values_map);
                    if (useSharedAccessSignature)
                    {
                        STRING_delete(shared_access);
                    }
                }
                STRING_delete(connection_string);
            }
        }
    }
    return result;
}